

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

int __thiscall Cmd::getColumns(Cmd *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t sVar4;
  uint uVar5;
  string_view str;
  string_view str_00;
  winsize ws;
  char seq [32];
  
  iVar1 = ioctl(1,0x5413,&ws);
  if (ws.ws_col == 0 || iVar1 == -1) {
    iVar1 = getCursorPosition(this);
    uVar5 = 0x50;
    if ((((iVar1 != -1) &&
         (str._M_str = "\x1b[999C", str._M_len = 6, sVar3 = write_string(this,str), sVar3 == 6)) &&
        (uVar2 = getCursorPosition(this), uVar2 != 0xffffffff)) &&
       (uVar5 = uVar2, iVar1 < (int)uVar2)) {
      snprintf(seq,0x20,"\x1b[%dD");
      sVar4 = strlen(seq);
      str_00._M_str = seq;
      str_00._M_len = sVar4;
      write_string(this,str_00);
    }
  }
  else {
    uVar5 = (uint)ws.ws_col;
  }
  return uVar5;
}

Assistant:

int getColumns() {
		struct winsize ws;

		if (ioctl(1, TIOCGWINSZ, &ws) == -1 || ws.ws_col == 0) {
			// ioctl() failed. Try to query the terminal itself.
			int start, cols;

			// Get the initial position so we can restore it later.
			start = getCursorPosition();
			if (start == -1)
				return 80;

			// Go to right margin and get position.
			if (write_string("\x1b[999C") != 6)
				return 80;
			cols = getCursorPosition();
			if (cols == -1)
				return 80;

			// Restore position.
			if (cols > start) {
				char seq[32];
				snprintf(seq, sizeof(seq), "\x1b[%dD", cols - start);
				if (write_string(seq) == -1) {
					// Can't recover...
				}
			}
			return cols;
		} else {
			return ws.ws_col;
		}
	}